

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O3

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::operator+
          (ChebyshevExpansion *__return_storage_ptr__,ChebyshevExpansion *this,
          ChebyshevExpansion *ce2)

{
  double *pdVar1;
  double dVar2;
  Index size;
  double *pdVar3;
  undefined8 *puVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  VectorXd c;
  vectype local_68;
  vectype local_58;
  ChebyshevExpansion *local_48;
  ChebyshevExpansion *local_40;
  
  uVar5 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  uVar6 = (ce2->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
  ;
  local_40 = this;
  if (uVar5 == uVar6) {
    local_48 = ce2;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_68,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_48);
    ChebyshevExpansion(__return_storage_ptr__,&local_68,this->m_xmin,this->m_xmax);
  }
  else {
    if ((long)uVar6 < (long)uVar5) {
      local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
      if ((long)uVar5 < 0) {
LAB_0010377d:
        local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
        ;
        local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)0x0;
        __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                      ,0x130,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      if (uVar5 == 0) {
        uVar6 = 0;
        pdVar3 = (double *)0x0;
        local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             uVar5;
      }
      else {
        if (0x1fffffffffffffff < uVar5) {
LAB_0010374f:
          puVar4 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar4 = operator_new;
          __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        pdVar3 = (double *)malloc(uVar5 * 8);
        if (uVar5 != 1 && ((ulong)pdVar3 & 0xf) != 0) {
LAB_001037f9:
          __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/util/Memory.h"
                        ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
        }
        if (pdVar3 == (double *)0x0) goto LAB_0010374f;
        uVar6 = uVar5 & 0x1ffffffffffffffe;
        local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             pdVar3;
        local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             uVar5;
        if (uVar5 != 1) {
          memset(pdVar3,0,uVar6 * 8);
        }
      }
      if (uVar6 != uVar5) {
        memset((void *)((uVar5 * 8 & 0xfffffffffffffff0) + (long)pdVar3),0,
               (ulong)((uint)(uVar5 * 8) & 8));
      }
      uVar6 = (ce2->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
      if (((long)uVar6 < 0) && (pdVar3 != (double *)0x0)) {
LAB_0010379c:
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/MapBase.h"
                      ,0xb2,
                      "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                     );
      }
      if (uVar5 < uVar6) {
LAB_001037bb:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Block.h"
                      ,0x93,
                      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      uVar5 = uVar6;
      if ((((ulong)pdVar3 & 7) == 0) &&
         (uVar5 = (ulong)((uint)((ulong)pdVar3 >> 3) & 1), uVar6 <= uVar5)) {
        uVar5 = uVar6;
      }
      pdVar1 = (ce2->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      lVar7 = uVar6 - uVar5;
      if (uVar5 != 0) {
        uVar8 = 0;
        do {
          pdVar3[uVar8] = pdVar1[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
      }
      uVar8 = (lVar7 - (lVar7 >> 0x3f) & 0xfffffffffffffffeU) + uVar5;
      if (1 < lVar7) {
        do {
          dVar2 = (pdVar1 + uVar5)[1];
          pdVar3[uVar5] = pdVar1[uVar5];
          (pdVar3 + uVar5)[1] = dVar2;
          uVar5 = uVar5 + 2;
        } while ((long)uVar5 < (long)uVar8);
      }
      if ((long)uVar8 < (long)uVar6) {
        do {
          pdVar3[uVar8] = pdVar1[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar6 != uVar8);
      }
      if (local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          != (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows) {
LAB_001037da:
        local_48 = (ChebyshevExpansion *)&local_68;
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CwiseBinaryOp.h"
                      ,0x74,
                      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                     );
      }
      local_48 = (ChebyshevExpansion *)&local_68;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_58,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_48);
      ChebyshevExpansion(__return_storage_ptr__,&local_58,this->m_xmin,this->m_xmax);
    }
    else {
      local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
      if ((long)uVar6 < 0) goto LAB_0010377d;
      if (uVar6 == 0) {
        uVar5 = 0;
        pdVar3 = (double *)0x0;
        local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             uVar6;
      }
      else {
        if (0x1fffffffffffffff < uVar6) goto LAB_0010374f;
        pdVar3 = (double *)malloc(uVar6 * 8);
        if (uVar6 != 1 && ((ulong)pdVar3 & 0xf) != 0) goto LAB_001037f9;
        if (pdVar3 == (double *)0x0) goto LAB_0010374f;
        uVar5 = uVar6 & 0x1ffffffffffffffe;
        local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             pdVar3;
        local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             uVar6;
        if (uVar6 != 1) {
          memset(pdVar3,0,uVar5 * 8);
        }
      }
      if (uVar5 != uVar6) {
        memset((void *)((uVar6 * 8 & 0xfffffffffffffff0) + (long)pdVar3),0,
               (ulong)((uint)(uVar6 * 8) & 8));
      }
      uVar5 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
      if (((long)uVar5 < 0) && (pdVar3 != (double *)0x0)) goto LAB_0010379c;
      if (uVar6 < uVar5) goto LAB_001037bb;
      uVar6 = uVar5;
      if ((((ulong)pdVar3 & 7) == 0) &&
         (uVar6 = (ulong)((uint)((ulong)pdVar3 >> 3) & 1), uVar5 <= uVar6)) {
        uVar6 = uVar5;
      }
      pdVar1 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      lVar7 = uVar5 - uVar6;
      if (uVar6 != 0) {
        uVar8 = 0;
        do {
          pdVar3[uVar8] = pdVar1[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar6 != uVar8);
      }
      uVar8 = (lVar7 - (lVar7 >> 0x3f) & 0xfffffffffffffffeU) + uVar6;
      if (1 < lVar7) {
        do {
          dVar2 = (pdVar1 + uVar6)[1];
          pdVar3[uVar6] = pdVar1[uVar6];
          (pdVar3 + uVar6)[1] = dVar2;
          uVar6 = uVar6 + 2;
        } while ((long)uVar6 < (long)uVar8);
      }
      if ((long)uVar8 < (long)uVar5) {
        do {
          pdVar3[uVar8] = pdVar1[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
      }
      local_40 = ce2;
      if (local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          != (ce2->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows) goto LAB_001037da;
      local_48 = (ChebyshevExpansion *)&local_68;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_58,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_48);
      ChebyshevExpansion(__return_storage_ptr__,&local_58,this->m_xmin,this->m_xmax);
    }
    free(local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  }
  free(local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return __return_storage_ptr__;
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::operator+(const ChebyshevExpansion &ce2) const {
        if (m_c.size() == ce2.coef().size()) {
            // Both are the same size, nothing creative to do, just add the coefficients
            return ChebyshevExpansion(std::move(ce2.coef() + m_c), m_xmin, m_xmax);
        }
        else{
            if (m_c.size() > ce2.coef().size()) {
                Eigen::VectorXd c(m_c.size()); c.setZero(); c.head(ce2.coef().size()) = ce2.coef();
                return ChebyshevExpansion(c+m_c, m_xmin, m_xmax);
            }
            else {
                std::size_t n = ce2.coef().size();
                Eigen::VectorXd c(n); c.setZero(); c.head(m_c.size()) = m_c;
                return ChebyshevExpansion(c + ce2.coef(), m_xmin, m_xmax);
            }
        }
    }